

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_yaml.cpp
# Opt level: O0

Language * Omega_h::yaml::build_language(void)

{
  reference pvVar1;
  Language *in_RDI;
  allocator local_5d2;
  allocator local_5d1;
  Token local_5d0;
  undefined1 local_58b;
  allocator local_58a;
  allocator local_589;
  Token local_588;
  undefined1 local_543;
  allocator local_542;
  allocator local_541;
  Token local_540;
  undefined1 local_4fb;
  allocator local_4fa;
  allocator local_4f9;
  Token local_4f8;
  undefined1 local_4b3;
  allocator local_4b2;
  allocator local_4b1;
  Token local_4b0;
  undefined1 local_46b;
  allocator local_46a;
  allocator local_469;
  Token local_468;
  undefined1 local_423;
  allocator local_422;
  allocator local_421;
  Token local_420;
  undefined1 local_3db;
  allocator local_3da;
  allocator local_3d9;
  Token local_3d8;
  undefined1 local_393;
  allocator local_392;
  allocator local_391;
  Token local_390;
  undefined1 local_34b;
  allocator local_34a;
  allocator local_349;
  Token local_348;
  undefined1 local_303;
  allocator local_302;
  allocator local_301;
  Token local_300;
  undefined1 local_2bb;
  allocator local_2ba;
  allocator local_2b9;
  Token local_2b8;
  undefined1 local_273;
  allocator local_272;
  allocator local_271;
  Token local_270;
  undefined1 local_22b;
  allocator local_22a;
  allocator local_229;
  Token local_228;
  undefined1 local_1e3;
  allocator local_1e2;
  allocator local_1e1;
  Token local_1e0;
  undefined1 local_19b;
  allocator local_19a;
  allocator local_199;
  Token local_198;
  undefined1 local_153;
  allocator local_152;
  allocator local_151;
  Token local_150;
  undefined1 local_10b;
  allocator local_10a;
  allocator local_109;
  Token local_108;
  undefined1 local_c3;
  allocator local_c2;
  allocator local_c1;
  Token local_c0;
  undefined1 local_7b;
  allocator local_7a;
  allocator local_79;
  Token local_78;
  Language *local_28;
  vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_> *toks;
  vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_> *prods;
  Language *out;
  
  prods._7_1_ = 0;
  Language::Language(in_RDI);
  toks = (vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_> *)
         &in_RDI->productions;
  local_28 = in_RDI;
  build_productions((vector<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
                     *)toks);
  std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::resize
            (&local_28->tokens,0x14);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"NEWLINE",&local_79);
  local_7b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78.regex,"((#[^\r\n]*)?\r?\n[ \t]*)+",&local_7a);
  local_7b = 0;
  pvVar1 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&local_28->tokens,0);
  Language::Token::operator=(pvVar1,&local_78);
  Language::Token::~Token(&local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_7a);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"INDENT",&local_c1);
  local_c3 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0.regex,"((#[^\r\n]*)?\r?\n[ \t]*)+",&local_c2);
  local_c3 = 0;
  pvVar1 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&local_28->tokens,1);
  Language::Token::operator=(pvVar1,&local_c0);
  Language::Token::~Token(&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c2);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"DEDENT",&local_109);
  local_10b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108.regex,"((#[^\r\n]*)?\r?\n[ \t]*)+",&local_10a);
  local_10b = 0;
  pvVar1 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&local_28->tokens,2);
  Language::Token::operator=(pvVar1,&local_108);
  Language::Token::~Token(&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_10a);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150,"WS",&local_151);
  local_153 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_150.regex,"[ \t]",&local_152);
  local_153 = 0;
  pvVar1 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&local_28->tokens,3);
  Language::Token::operator=(pvVar1,&local_150);
  Language::Token::~Token(&local_150);
  std::allocator<char>::~allocator((allocator<char> *)&local_152);
  std::allocator<char>::~allocator((allocator<char> *)&local_151);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198,":",&local_199);
  local_19b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_198.regex,":",&local_19a);
  local_19b = 0;
  pvVar1 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&local_28->tokens,4);
  Language::Token::operator=(pvVar1,&local_198);
  Language::Token::~Token(&local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_19a);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e0,".",&local_1e1);
  local_1e3 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e0.regex,"\\.",&local_1e2);
  local_1e3 = 0;
  pvVar1 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&local_28->tokens,5);
  Language::Token::operator=(pvVar1,&local_1e0);
  Language::Token::~Token(&local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e2);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_228,"-",&local_229);
  local_22b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_228.regex,"\\-",&local_22a);
  local_22b = 0;
  pvVar1 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&local_28->tokens,6);
  Language::Token::operator=(pvVar1,&local_228);
  Language::Token::~Token(&local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_22a);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_270,"\"",&local_271);
  local_273 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_270.regex,"\"",&local_272);
  local_273 = 0;
  pvVar1 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&local_28->tokens,7);
  Language::Token::operator=(pvVar1,&local_270);
  Language::Token::~Token(&local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_272);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b8,"\'",&local_2b9);
  local_2bb = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2b8.regex,"\'",&local_2ba);
  local_2bb = 0;
  pvVar1 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&local_28->tokens,8);
  Language::Token::operator=(pvVar1,&local_2b8);
  Language::Token::~Token(&local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2ba);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_300,"\\",&local_301);
  local_303 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_300.regex,"\\\\",&local_302);
  local_303 = 0;
  pvVar1 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&local_28->tokens,9);
  Language::Token::operator=(pvVar1,&local_300);
  Language::Token::~Token(&local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_302);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_348,"|",&local_349);
  local_34b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_348.regex,"\\|",&local_34a);
  local_34b = 0;
  pvVar1 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&local_28->tokens,10);
  Language::Token::operator=(pvVar1,&local_348);
  Language::Token::~Token(&local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_34a);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_390,"[",&local_391);
  local_393 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_390.regex,"\\[",&local_392);
  local_393 = 0;
  pvVar1 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&local_28->tokens,0xb);
  Language::Token::operator=(pvVar1,&local_390);
  Language::Token::~Token(&local_390);
  std::allocator<char>::~allocator((allocator<char> *)&local_392);
  std::allocator<char>::~allocator((allocator<char> *)&local_391);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3d8,"]",&local_3d9);
  local_3db = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3d8.regex,"\\]",&local_3da);
  local_3db = 0;
  pvVar1 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&local_28->tokens,0xc);
  Language::Token::operator=(pvVar1,&local_3d8);
  Language::Token::~Token(&local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3da);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_420,"{",&local_421);
  local_423 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_420.regex,"{",&local_422);
  local_423 = 0;
  pvVar1 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&local_28->tokens,0xd);
  Language::Token::operator=(pvVar1,&local_420);
  Language::Token::~Token(&local_420);
  std::allocator<char>::~allocator((allocator<char> *)&local_422);
  std::allocator<char>::~allocator((allocator<char> *)&local_421);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_468,"}",&local_469);
  local_46b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_468.regex,"}",&local_46a);
  local_46b = 0;
  pvVar1 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&local_28->tokens,0xe);
  Language::Token::operator=(pvVar1,&local_468);
  Language::Token::~Token(&local_468);
  std::allocator<char>::~allocator((allocator<char> *)&local_46a);
  std::allocator<char>::~allocator((allocator<char> *)&local_469);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4b0,">",&local_4b1);
  local_4b3 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4b0.regex,">",&local_4b2);
  local_4b3 = 0;
  pvVar1 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&local_28->tokens,0xf);
  Language::Token::operator=(pvVar1,&local_4b0);
  Language::Token::~Token(&local_4b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b2);
  std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4f8,",",&local_4f9);
  local_4fb = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4f8.regex,",",&local_4fa);
  local_4fb = 0;
  pvVar1 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&local_28->tokens,0x10);
  Language::Token::operator=(pvVar1,&local_4f8);
  Language::Token::~Token(&local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4fa);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_540,"%",&local_541);
  local_543 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_540.regex,"%",&local_542);
  local_543 = 0;
  pvVar1 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&local_28->tokens,0x11);
  Language::Token::operator=(pvVar1,&local_540);
  Language::Token::~Token(&local_540);
  std::allocator<char>::~allocator((allocator<char> *)&local_542);
  std::allocator<char>::~allocator((allocator<char> *)&local_541);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_588,"!",&local_589);
  local_58b = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_588.regex,"!",&local_58a);
  local_58b = 0;
  pvVar1 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&local_28->tokens,0x12);
  Language::Token::operator=(pvVar1,&local_588);
  Language::Token::~Token(&local_588);
  std::allocator<char>::~allocator((allocator<char> *)&local_58a);
  std::allocator<char>::~allocator((allocator<char> *)&local_589);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5d0,"OTHERCHAR",&local_5d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5d0.regex,"[^ \t:\\.\\-\"\'\\\\\\|\\[\\]{}>,%#!\n\r]",&local_5d2);
  pvVar1 = std::vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>::
           operator[](&local_28->tokens,0x13);
  Language::Token::operator=(pvVar1,&local_5d0);
  Language::Token::~Token(&local_5d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d2);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
  return in_RDI;
}

Assistant:

Language build_language() {
  Language out;
  auto& prods = out.productions;
  auto& toks = out.tokens;
  build_productions(prods);
  toks.resize(NTOKS);
  toks[TOK_NEWLINE] = {"NEWLINE", "((#[^\r\n]*)?\r?\n[ \t]*)+"};
  toks[TOK_INDENT] = {"INDENT", "((#[^\r\n]*)?\r?\n[ \t]*)+"};
  toks[TOK_DEDENT] = {"DEDENT", "((#[^\r\n]*)?\r?\n[ \t]*)+"};
  toks[TOK_SPACE] = {"WS", "[ \t]"};
  toks[TOK_COLON] = {":", ":"};
  toks[TOK_DOT] = {".", "\\."};
  toks[TOK_DASH] = {"-", "\\-"};
  toks[TOK_DQUOT] = {"\"", "\""};
  toks[TOK_SQUOT] = {"'", "'"};
  toks[TOK_SLASH] = {"\\", "\\\\"};
  toks[TOK_PIPE] = {"|", "\\|"};
  toks[TOK_LSQUARE] = {"[", "\\["};
  toks[TOK_RSQUARE] = {"]", "\\]"};
  toks[TOK_LCURLY] = {"{", "{"};
  toks[TOK_RCURLY] = {"}", "}"};
  toks[TOK_RANGLE] = {">", ">"};
  toks[TOK_COMMA] = {",", ","};
  toks[TOK_PERCENT] = {"%", "%"};
  toks[TOK_EXCL] = {"!", "!"};
  toks[TOK_OTHER] = {"OTHERCHAR", "[^ \t:\\.\\-\"'\\\\\\|\\[\\]{}>,%#!\n\r]"};
  return out;
}